

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<float>::erase(RepeatedField<float> *this,const_iterator position)

{
  void *__dest;
  void *pvVar1;
  LogMessage *other;
  size_t __n;
  long lVar2;
  int iVar3;
  LogMessage local_70;
  LogFinisher local_31;
  
  pvVar1 = this->arena_or_elements_;
  lVar2 = (long)(int)((ulong)((long)position - (long)pvVar1) >> 2);
  __dest = (void *)((long)pvVar1 + lVar2 * 4);
  __n = (long)pvVar1 + ((long)this->current_size_ * 4 - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
  }
  iVar3 = (int)((long)__dest + (__n - (long)this->arena_or_elements_) >> 2);
  if (this->current_size_ < iVar3) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x63d);
    other = internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (new_size) <= (current_size_): ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_70);
  }
  if (0 < this->current_size_) {
    this->current_size_ = iVar3;
  }
  return (iterator)(lVar2 * 4 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}